

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O3

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::WriteFunctions
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *this)

{
  uint uVar1;
  ulong uVar2;
  
  if (0 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_funcs) {
    uVar2 = 0;
    do {
      BinaryFormatter::apr(&this->super_FormatterType,&this->nm,"F%d %d %d %s\n",uVar2,0,0,"");
      uVar1 = (int)uVar2 + 1;
      uVar2 = (ulong)uVar1;
    } while ((int)uVar1 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_funcs);
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteFunctions() {
  for (int i=0; i<Hdr().num_funcs; ++i) {
    auto func = Feeder().Function(i);
    apr(nm, "F%d %d %d %s\n", i,
        (int)func.Type(),
        (int)func.NumArgs(),
        func.Name());
  }
}